

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O0

void VP8DefaultProbas(VP8Encoder *enc)

{
  long in_RDI;
  VP8EncProba *probas;
  
  *(undefined4 *)(in_RDI + 0x5bcc) = 0;
  memset((void *)(in_RDI + 0xe20),0xff,3);
  memcpy((void *)(in_RDI + 0xe24),VP8CoeffsProba0,0x420);
  *(undefined4 *)(in_RDI + 0x5bc8) = 1;
  return;
}

Assistant:

void VP8DefaultProbas(VP8Encoder* const enc) {
  VP8EncProba* const probas = &enc->proba_;
  probas->use_skip_proba_ = 0;
  memset(probas->segments_, 255u, sizeof(probas->segments_));
  memcpy(probas->coeffs_, VP8CoeffsProba0, sizeof(VP8CoeffsProba0));
  // Note: we could hard-code the level_costs_ corresponding to VP8CoeffsProba0,
  // but that's ~11k of static data. Better call VP8CalculateLevelCosts() later.
  probas->dirty_ = 1;
}